

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-message.h
# Opt level: O2

Message * __thiscall testing::Message::operator<<(Message *this,wchar_t *wide_c_str)

{
  Message *pMVar1;
  String local_20;
  
  internal::String::ShowWideCString(&local_20,wide_c_str);
  pMVar1 = operator<<(this,&local_20);
  internal::String::~String(&local_20);
  return pMVar1;
}

Assistant:

Message& operator <<(wchar_t* wide_c_str) {
    return *this << internal::String::ShowWideCString(wide_c_str);
  }